

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

CSharpType google::protobuf::compiler::csharp::GetCSharpType(Type type)

{
  LogMessage *pLVar1;
  LogMessage local_28;
  Voidify local_11;
  Type local_10;
  CSharpType local_c;
  Type type_local;
  
  switch(type) {
  case TYPE_DOUBLE:
    local_c = CSHARPTYPE_DOUBLE;
    break;
  case TYPE_FLOAT:
    local_c = CSHARPTYPE_FLOAT;
    break;
  case TYPE_INT64:
    local_c = CSHARPTYPE_INT64;
    break;
  case TYPE_UINT64:
    local_c = CSHARPTYPE_UINT32;
    break;
  case TYPE_INT32:
    local_c = CSHARPTYPE_INT32;
    break;
  case TYPE_FIXED64:
    local_c = CSHARPTYPE_UINT64;
    break;
  case TYPE_FIXED32:
    local_c = CSHARPTYPE_UINT32;
    break;
  case TYPE_BOOL:
    local_c = CSHARPTYPE_BOOL;
    break;
  case TYPE_STRING:
    local_c = CSHARPTYPE_STRING;
    break;
  case TYPE_GROUP:
    local_c = CSHARPTYPE_MESSAGE;
    break;
  case TYPE_MESSAGE:
    local_c = CSHARPTYPE_MESSAGE;
    break;
  case TYPE_BYTES:
    local_c = CSHARPTYPE_BYTESTRING;
    break;
  case TYPE_UINT32:
    local_c = CSHARPTYPE_UINT32;
    break;
  case TYPE_ENUM:
    local_c = CSHARPTYPE_ENUM;
    break;
  case TYPE_SFIXED32:
    local_c = CSHARPTYPE_INT32;
    break;
  case TYPE_SFIXED64:
    local_c = CSHARPTYPE_INT64;
    break;
  case TYPE_SINT32:
    local_c = CSHARPTYPE_INT32;
    break;
  case MAX_TYPE:
    local_c = CSHARPTYPE_INT64;
    break;
  default:
    local_10 = type;
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_helpers.cc"
               ,0x5b);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [16])"Can\'t get here.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_28);
  }
  return local_c;
}

Assistant:

CSharpType GetCSharpType(FieldDescriptor::Type type) {
  switch (type) {
    case FieldDescriptor::TYPE_INT32:
      return CSHARPTYPE_INT32;
    case FieldDescriptor::TYPE_INT64:
      return CSHARPTYPE_INT64;
    case FieldDescriptor::TYPE_UINT32:
      return CSHARPTYPE_UINT32;
    case FieldDescriptor::TYPE_UINT64:
      return CSHARPTYPE_UINT32;
    case FieldDescriptor::TYPE_SINT32:
      return CSHARPTYPE_INT32;
    case FieldDescriptor::TYPE_SINT64:
      return CSHARPTYPE_INT64;
    case FieldDescriptor::TYPE_FIXED32:
      return CSHARPTYPE_UINT32;
    case FieldDescriptor::TYPE_FIXED64:
      return CSHARPTYPE_UINT64;
    case FieldDescriptor::TYPE_SFIXED32:
      return CSHARPTYPE_INT32;
    case FieldDescriptor::TYPE_SFIXED64:
      return CSHARPTYPE_INT64;
    case FieldDescriptor::TYPE_FLOAT:
      return CSHARPTYPE_FLOAT;
    case FieldDescriptor::TYPE_DOUBLE:
      return CSHARPTYPE_DOUBLE;
    case FieldDescriptor::TYPE_BOOL:
      return CSHARPTYPE_BOOL;
    case FieldDescriptor::TYPE_ENUM:
      return CSHARPTYPE_ENUM;
    case FieldDescriptor::TYPE_STRING:
      return CSHARPTYPE_STRING;
    case FieldDescriptor::TYPE_BYTES:
      return CSHARPTYPE_BYTESTRING;
    case FieldDescriptor::TYPE_GROUP:
      return CSHARPTYPE_MESSAGE;
    case FieldDescriptor::TYPE_MESSAGE:
      return CSHARPTYPE_MESSAGE;

      // No default because we want the compiler to complain if any new
      // types are added.
  }
  ABSL_LOG(FATAL) << "Can't get here.";
  return (CSharpType)-1;
}